

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Quaternion QuaternionSlerp(Quaternion q1,Quaternion q2,float amount)

{
  Quaternion q1_00;
  Quaternion QVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Quaternion QVar5;
  float ratioB;
  float ratioA;
  float sinHalfTheta;
  float halfTheta;
  float local_40;
  float cosHalfTheta;
  float amount_local;
  Quaternion q2_local;
  Quaternion q1_local;
  Quaternion result;
  
  q2_local.z = q1.x;
  q2_local.w = q1.y;
  q1_local.x = q1.z;
  q1_local.y = q1.w;
  cosHalfTheta = q2.x;
  amount_local = q2.y;
  q2_local.x = q2.z;
  q2_local.y = q2.w;
  memset(&q1_local.z,0,0x10);
  local_40 = q1_local.y * q2_local.y +
             q1_local.x * q2_local.x + q2_local.z * cosHalfTheta + q2_local.w * amount_local;
  if (local_40 < 0.0) {
    cosHalfTheta = -cosHalfTheta;
    amount_local = -amount_local;
    q2_local.x = -q2_local.x;
    q2_local.y = -q2_local.y;
    local_40 = -local_40;
  }
  if (ABS(local_40) < 1.0) {
    if (local_40 <= 0.95) {
      fVar2 = acosf(local_40);
      fVar3 = sqrtf(-local_40 * local_40 + 1.0);
      if (0.001 <= ABS(fVar3)) {
        fVar4 = sinf((1.0 - amount) * fVar2);
        fVar4 = fVar4 / fVar3;
        fVar2 = sinf(amount * fVar2);
        fVar2 = fVar2 / fVar3;
        q1_local.z = q2_local.z * fVar4 + cosHalfTheta * fVar2;
        q1_local.w = q2_local.w * fVar4 + amount_local * fVar2;
        result.x = q1_local.x * fVar4 + q2_local.x * fVar2;
        result.y = q1_local.y * fVar4 + q2_local.y * fVar2;
      }
      else {
        q1_local.z = q2_local.z * 0.5 + cosHalfTheta * 0.5;
        q1_local.w = q2_local.w * 0.5 + amount_local * 0.5;
        result.x = q1_local.x * 0.5 + q2_local.x * 0.5;
        result.y = q1_local.y * 0.5 + q2_local.y * 0.5;
      }
    }
    else {
      q1_00.z = q1_local.x;
      q1_00.x = (float)(int)q1._0_8_;
      q1_00.y = (float)(int)((ulong)q1._0_8_ >> 0x20);
      q1_00.w = q1_local.y;
      QVar5.y = amount_local;
      QVar5.x = cosHalfTheta;
      QVar5.z = q2_local.x;
      QVar5.w = q2_local.y;
      QVar5 = QuaternionNlerp(q1_00,QVar5,amount);
      q1_local.z = QVar5.x;
      q1_local.w = QVar5.y;
      result.x = QVar5.z;
      result.y = QVar5.w;
    }
  }
  else {
    result.x = q1_local.x;
    result.y = q1_local.y;
    q1_local.z = q2_local.z;
    q1_local.w = q2_local.w;
  }
  QVar1.y = q1_local.w;
  QVar1.x = q1_local.z;
  QVar1.z = result.x;
  QVar1.w = result.y;
  return QVar1;
}

Assistant:

RMDEF Quaternion QuaternionSlerp(Quaternion q1, Quaternion q2, float amount)
{
    Quaternion result = { 0 };

    float cosHalfTheta =  q1.x*q2.x + q1.y*q2.y + q1.z*q2.z + q1.w*q2.w;

    if (cosHalfTheta < 0)
    {
        q2.x = -q2.x; q2.y = -q2.y; q2.z = -q2.z; q2.w = -q2.w;
        cosHalfTheta = -cosHalfTheta;
    }

    if (fabs(cosHalfTheta) >= 1.0f) result = q1;
    else if (cosHalfTheta > 0.95f) result = QuaternionNlerp(q1, q2, amount);
    else
    {
        float halfTheta = acosf(cosHalfTheta);
        float sinHalfTheta = sqrtf(1.0f - cosHalfTheta*cosHalfTheta);

        if (fabs(sinHalfTheta) < 0.001f)
        {
            result.x = (q1.x*0.5f + q2.x*0.5f);
            result.y = (q1.y*0.5f + q2.y*0.5f);
            result.z = (q1.z*0.5f + q2.z*0.5f);
            result.w = (q1.w*0.5f + q2.w*0.5f);
        }
        else
        {
            float ratioA = sinf((1 - amount)*halfTheta)/sinHalfTheta;
            float ratioB = sinf(amount*halfTheta)/sinHalfTheta;

            result.x = (q1.x*ratioA + q2.x*ratioB);
            result.y = (q1.y*ratioA + q2.y*ratioB);
            result.z = (q1.z*ratioA + q2.z*ratioB);
            result.w = (q1.w*ratioA + q2.w*ratioB);
        }
    }

    return result;
}